

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O3

int conn_recv(conn_handle *conn,uint8_t *buff,size_t buff_len)

{
  void *pvVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  
  iVar5 = -0x5b;
  if (conn->type == CONN_TYPE_TCP) {
    pvVar1 = conn->priv;
    mutex_lock_shared((mutex_handle *)((long)pvVar1 + 0x90));
    if (*(int *)((long)pvVar1 + 8) == -1) {
      iVar5 = -0x6b;
    }
    else {
      iVar5 = 0;
      if (buff_len != 0) {
        do {
          sVar3 = recvfrom(*(int *)((long)pvVar1 + 8),buff,buff_len & 0xffffffff,0,(sockaddr *)0x0,
                           (socklen_t *)0x0);
          iVar2 = (int)sVar3;
          if (iVar2 == 0) {
            iVar5 = -0x20;
            break;
          }
          if (iVar2 == -1) {
            piVar4 = __errno_location();
            iVar5 = -*piVar4;
            break;
          }
          buff = buff + iVar2;
          iVar5 = iVar5 + iVar2;
          buff_len = buff_len - (long)iVar2;
        } while (buff_len != 0);
      }
    }
    mutex_unlock_shared((mutex_handle *)((long)pvVar1 + 0x90));
  }
  return iVar5;
}

Assistant:

int conn_recv(struct conn_handle *conn, uint8_t *buff, size_t buff_len)
{
	struct conn_priv *priv = conn->priv;
	int ret = 0;
	int bytes_read = 0;

	if (conn->type != CONN_TYPE_TCP)
		return -EPROTOTYPE;

	mutex_lock_shared(&priv->mutex);

	if (priv->fd == INVALID_SOCKET) {
		ret = -ENOTCONN;

		goto conn_recv_exit;
	}

	while (buff_len > 0) {
		ret = recvfrom(priv->fd, (char *)buff, (socklen_t)buff_len, 0,
			       NULL, NULL);

		if (ret == 0) {
			ret = -EPIPE;

			goto conn_recv_exit;
		} else if (ret == SOCKET_ERROR) {
			ret = SOCK_ERRNO;

#ifdef _WIN32
			if (ret == -WSAESHUTDOWN)
				ret = -EPIPE;

#endif

			goto conn_recv_exit;
		}

		buff_len -= ret;
		buff += ret;
		ret = bytes_read += ret;
	}

conn_recv_exit:
	mutex_unlock_shared(&priv->mutex);

	return ret;
}